

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O3

AdsHandle * __thiscall
AdsDevice::OpenFile(AdsHandle *__return_storage_ptr__,AdsDevice *this,string *filename,
                   uint32_t flags)

{
  long adsErrorCode;
  uint *puVar1;
  AdsException *this_00;
  uint local_78;
  uint32_t bytesRead;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  
  bytesRead = 0;
  if (filename->_M_string_length >> 0x20 == 0) {
    adsErrorCode = AdsSyncReadWriteReqEx2
                             (*(this->m_LocalPort)._M_t.
                               super___uniq_ptr_impl<const_long,_ResourceDeleter<const_long>_>._M_t.
                               super__Tuple_impl<0UL,_const_long_*,_ResourceDeleter<const_long>_>.
                               super__Head_base<0UL,_const_long_*,_false>._M_head_impl,&this->m_Addr
                              ,0x78,flags,4,&local_78,(uint32_t)filename->_M_string_length,
                              (filename->_M_dataplus)._M_p,&bytesRead);
    if (adsErrorCode == 0) {
      puVar1 = (uint *)operator_new(4);
      *puVar1 = local_78;
      local_70._8_8_ = 0;
      local_70._M_unused._M_object = operator_new(0x18);
      *(code **)local_70._M_unused._0_8_ = CloseFile;
      *(undefined8 *)((long)local_70._M_unused._0_8_ + 8) = 0;
      *(AdsDevice **)((long)local_70._M_unused._0_8_ + 0x10) = this;
      local_58 = std::
                 _Function_handler<long_(unsigned_int),_std::_Bind<long_(AdsDevice::*(const_AdsDevice_*,_std::_Placeholder<1>))(unsigned_int)_const>_>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<long_(unsigned_int),_std::_Bind<long_(AdsDevice::*(const_AdsDevice_*,_std::_Placeholder<1>))(unsigned_int)_const>_>
                 ::_M_manager;
      std::function<long_(unsigned_int)>::function
                ((function<long_(unsigned_int)> *)&local_50,
                 (function<long_(unsigned_int)> *)&local_70);
      std::function<long_(unsigned_int)>::function
                ((function<long_(unsigned_int)> *)__return_storage_ptr__,
                 (function<long_(unsigned_int)> *)&local_50);
      (__return_storage_ptr__->_M_t).
      super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar1;
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      return __return_storage_ptr__;
    }
  }
  else {
    adsErrorCode = 0x705;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,adsErrorCode);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

AdsHandle AdsDevice::OpenFile(const std::string& filename, const uint32_t flags) const
{
    uint32_t bytesRead = 0;
    uint32_t handle;
    const auto error = ReadWriteReqEx2(SYSTEMSERVICE_FOPEN,
                                       flags,
                                       sizeof(handle),
                                       &handle,
                                       filename.length(),
                                       filename.c_str(),
                                       &bytesRead);

    if (error) {
        throw AdsException(error);
    }
    handle = bhf::ads::letoh(handle);
    return {new uint32_t {handle}, {std::bind(&AdsDevice::CloseFile, this, std::placeholders::_1)}};
}